

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

void Omega_h::repro_sum(CommPtr *comm,Reals *a,Int ncomps,Real *result)

{
  ulong uVar1;
  ulong uVar2;
  Real RVar3;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_60;
  Write<double> local_50;
  Omega_h local_40 [16];
  
  uVar2 = 0;
  uVar1 = 0;
  if (0 < ncomps) {
    uVar1 = (ulong)(uint)ncomps;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
    Write<double>::Write(&local_50,&a->write_);
    get_component<double>(local_40,(Read<double> *)&local_50,ncomps,(Int)uVar2);
    RVar3 = repro_sum((CommPtr *)&local_60,(Reals *)local_40);
    result[uVar2] = RVar3;
    Write<double>::~Write((Write<double> *)local_40);
    Write<double>::~Write(&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  }
  return;
}

Assistant:

void repro_sum(CommPtr comm, Reals a, Int ncomps, Real result[]) {
  for (Int comp = 0; comp < ncomps; ++comp) {
    result[comp] = repro_sum(comm, get_component(a, ncomps, comp));
  }
}